

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

ON_2dPoint __thiscall ON_SubDMeshFragment::PackRectCenter(ON_SubDMeshFragment *this)

{
  ON_2dPoint local_18;
  
  ON_2dPoint::ON_2dPoint
            (&local_18,
             (this->m_pack_rect[0][0] + this->m_pack_rect[1][0] + this->m_pack_rect[2][0] +
             this->m_pack_rect[3][0]) * 0.25,
             (this->m_pack_rect[0][1] + this->m_pack_rect[1][1] + this->m_pack_rect[2][1] +
             this->m_pack_rect[3][1]) * 0.25);
  return local_18;
}

Assistant:

const ON_2dPoint  ON_SubDMeshFragment::PackRectCenter() const
{
  return ON_2dPoint(
    0.25 * (m_pack_rect[0][0] + m_pack_rect[1][0] + m_pack_rect[2][0] + m_pack_rect[3][0]),
    0.25 * (m_pack_rect[0][1] + m_pack_rect[1][1] + m_pack_rect[2][1] + m_pack_rect[3][1])
  );
}